

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeUnary(ValueBuilder *this,IString op,Ref value)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_30;
  Ref local_28;
  Ref value_local;
  IString op_local;
  
  local_28.inst = (Value *)op.str._M_str;
  op_local.str._M_len = op.str._M_len;
  value_local.inst = (Value *)this;
  local_30 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_30);
  RVar2 = makeRawString((IString *)UNARY_PREFIX);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawString((IString *)&value_local);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,local_28);
  Ref::Ref((Ref *)&op_local.str._M_str,pVVar1);
  return (Ref)(Value *)op_local.str._M_str;
}

Assistant:

static Ref makeUnary(IString op, Ref value) {
    return &makeRawArray(3)
              ->push_back(makeRawString(UNARY_PREFIX))
              .push_back(makeRawString(op))
              .push_back(value);
  }